

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O2

ByteData * __thiscall
cfd::core::ByteData160::Join<cfd::core::ByteData,cfd::core::ByteData160,cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData160 *this,ByteData *top,ByteData160 *args,
          ByteData256 *args_1)

{
  ByteData result;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  Join<cfd::core::ByteData>((ByteData *)&_Stack_38,this,top);
  ByteData::Join<cfd::core::ByteData160,cfd::core::ByteData256>
            (__return_storage_ptr__,(ByteData *)&_Stack_38,args,args_1);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData Join(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Join(top);
    return result.Join(args...);
  }